

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.h
# Opt level: O2

void __thiscall
ktx::OptionsSingleIn::process
          (OptionsSingleIn *this,Options *param_1,ParseResult *args,Reporter *report)

{
  size_t sVar1;
  size_t sVar2;
  OptionValue *this_00;
  allocator<char> local_6a;
  allocator<char> local_69;
  string local_68;
  string local_48;
  
  if ((args->m_unmatched).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (args->m_unmatched).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    Reporter::fatal_usage<char_const(&)[30]>(report,(char (*) [30])"Too many filenames specified.");
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"stdin",&local_69);
  sVar1 = cxxopts::ParseResult::count(args,&local_68);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"input-file",&local_6a);
  sVar2 = cxxopts::ParseResult::count(args,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  if (sVar1 + sVar2 == 0) {
    Reporter::fatal_usage<char_const(&)[70]>
              (report,(char (*) [70])
                      "Missing input file. Either <input-file> or --stdin must be specified.");
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"stdin",&local_69);
  sVar1 = cxxopts::ParseResult::count(args,&local_68);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"input-file",&local_6a);
  sVar2 = cxxopts::ParseResult::count(args,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  if (1 < sVar2 + sVar1) {
    Reporter::fatal_usage<char_const(&)[78]>
              (report,(char (*) [78])
                      "Conflicting options: Only one can be specified from <input-file> and --stdin."
              );
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"stdin",(allocator<char> *)&local_48);
  sVar1 = cxxopts::ParseResult::count(args,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  if (sVar1 == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"input-file",(allocator<char> *)&local_48);
    this_00 = cxxopts::ParseResult::operator[](args,&local_68);
    cxxopts::OptionValue::as<std::__cxx11::string>(this_00);
    std::__cxx11::string::_M_assign((string *)this);
    std::__cxx11::string::~string((string *)&local_68);
  }
  else {
    std::__cxx11::string::assign((char *)this);
  }
  return;
}

Assistant:

void process(cxxopts::Options&, cxxopts::ParseResult& args, Reporter& report) {
        if (!args.unmatched().empty())
            report.fatal_usage("Too many filenames specified.");

        if (args.count("stdin") + args.count("input-file") == 0)
            report.fatal_usage("Missing input file. Either <input-file> or --stdin must be specified.");
        if (args.count("stdin") + args.count("input-file") > 1)
            report.fatal_usage("Conflicting options: Only one can be specified from <input-file> and --stdin.");

        if (args.count("stdin"))
            inputFilepath = "-";
        else
            inputFilepath = args["input-file"].as<std::string>();
    }